

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O0

void __thiscall QuantNet::QuantNet(QuantNet *this)

{
  int iVar1;
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *pvVar2;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar3;
  Net *in_RDI;
  Net *in_stack_ffffffffffffff80;
  
  ncnn::Net::Net(in_stack_ffffffffffffff80);
  in_RDI->_vptr_Net = (_func_int **)&PTR__QuantNet_009da380;
  pvVar2 = ncnn::Net::mutable_blobs(in_RDI);
  in_RDI[1]._vptr_Net = (_func_int **)pvVar2;
  pvVar3 = ncnn::Net::mutable_layers(in_RDI);
  *(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)&in_RDI[1].opt = pvVar3;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)0x14c84d);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)0x14c860);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)0x14c876);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x14c88c);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x14c8a2);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x14c8b8);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x14c8ce);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x14c8e4);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x14c8fa);
  std::vector<QuantBlobStat,_std::allocator<QuantBlobStat>_>::vector
            ((vector<QuantBlobStat,_std::allocator<QuantBlobStat>_> *)0x14c910);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x14c926);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x14c93c);
  iVar1 = ncnn::get_cpu_count();
  in_RDI[2].opt.flush_denormals = iVar1;
  return;
}

Assistant:

QuantNet::QuantNet()
    : blobs(mutable_blobs()), layers(mutable_layers())
{
    quantize_num_threads = ncnn::get_cpu_count();
}